

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parser::ReleaseTemporaryGuestArena(Parser *this)

{
  if (this->m_tempGuestArenaReleased == false) {
    (this->m_registeredRegexPatterns).
    super_SListBase<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->m_registeredRegexPatterns;
    (this->m_registeredRegexPatterns).
    super_SListBase<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount
    .count = 0;
    if (this->m_scriptContext != (ScriptContext *)0x0) {
      Js::ScriptContext::ReleaseTemporaryGuestAllocator
                (this->m_scriptContext,
                 (this->m_tempGuestArena).
                 super_RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>.ptr);
      if ((this->m_tempGuestArena).super_RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>.ptr
          != (TempArenaAllocatorWrapper<true> *)0x0) {
        Memory::RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::Unroot
                  (&(this->m_tempGuestArena).
                    super_RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>,
                   (this->m_tempGuestArena).recycler);
      }
    }
    this->m_tempGuestArenaReleased = true;
  }
  return;
}

Assistant:

void Parser::ReleaseTemporaryGuestArena()
{
    // In case of modules the Parser lives longer than the temporary Guest Arena. We may have already released the arena explicitly.
    if (!m_tempGuestArenaReleased)
    {
        // The regex patterns list has references to the temporary Guest Arena. Reset it first.
        m_registeredRegexPatterns.Reset();

        if (this->m_scriptContext != nullptr)
        {
            this->m_scriptContext->ReleaseTemporaryGuestAllocator(m_tempGuestArena);
            m_tempGuestArena.Unroot();
        }

        m_tempGuestArenaReleased = true;
    }
}